

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verStream.c
# Opt level: O2

void Ver_StreamSkipChars(Ver_Stream_t *p,char *pCharsToSkip)

{
  char cVar1;
  char *pcVar2;
  char *pcVar3;
  
  if (p->fStop != 0) {
    __assert_fail("!p->fStop",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                  ,0x133,"void Ver_StreamSkipChars(Ver_Stream_t *, char *)");
  }
  if (pCharsToSkip != (char *)0x0) {
    pcVar2 = p->pBufferCur;
    if (p->pBufferStop < pcVar2) {
      Ver_StreamReload(p);
      pcVar2 = p->pBufferCur;
    }
    do {
      pcVar3 = pCharsToSkip;
      if (p->pBufferEnd <= pcVar2) {
        if (p->pBufferStop == p->pBufferEnd) {
          p->fStop = 1;
          return;
        }
        printf("Ver_StreamSkipSymbol() failed to parse the file \"%s\".\n",p->pFileName);
        return;
      }
      do {
        cVar1 = *pcVar3;
        if (cVar1 == '\0') {
          p->pBufferCur = pcVar2;
          return;
        }
        pcVar3 = pcVar3 + 1;
      } while (*pcVar2 != cVar1);
      if (cVar1 == '\n') {
        p->nLineCounter = p->nLineCounter + 1;
      }
      pcVar2 = pcVar2 + 1;
    } while( true );
  }
  __assert_fail("pCharsToSkip != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/ver/verStream.c"
                ,0x134,"void Ver_StreamSkipChars(Ver_Stream_t *, char *)");
}

Assistant:

void Ver_StreamSkipChars( Ver_Stream_t * p, char * pCharsToSkip )
{
    char * pChar, * pTemp;
    assert( !p->fStop );
    assert( pCharsToSkip != NULL );
    // check if the new data should to be loaded
    if ( p->pBufferCur > p->pBufferStop )
        Ver_StreamReload( p );
    // skip the symbols
    for ( pChar = p->pBufferCur; pChar < p->pBufferEnd; pChar++ )
    {
        // skip symbols as long as they are in the list
        for ( pTemp = pCharsToSkip; *pTemp; pTemp++ )
            if ( *pChar == *pTemp )
                break;
        if ( *pTemp == 0 ) // pChar is not found in the list
        {
            p->pBufferCur = pChar;
            return;
        }
        // count the lines
        if ( *pChar == '\n' )
            p->nLineCounter++;
    }
    // the file is finished or the last part continued 
    // through VER_OFFSET_SIZE chars till the end of the buffer
    if ( p->pBufferStop == p->pBufferEnd ) // end of file
    {
        p->fStop = 1;
        return;
    }
    printf( "Ver_StreamSkipSymbol() failed to parse the file \"%s\".\n", p->pFileName );
}